

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.h
# Opt level: O1

void pbrt::ErrorExit<std::__cxx11::string&>
               (FileLoc *loc,char *fmt,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  string ret;
  string local_30;
  
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  local_30._M_string_length = 0;
  local_30.field_2._M_local_buf[0] = '\0';
  detail::stringPrintfRecursive<std::__cxx11::string&>(&local_30,fmt,args);
  ErrorExit(loc,local_30._M_dataplus._M_p);
}

Assistant:

[[noreturn]] inline void ErrorExit(const FileLoc *loc, const char *fmt, Args &&... args) {
    ErrorExit(loc, StringPrintf(fmt, std::forward<Args>(args)...).c_str());
}